

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

bool __thiscall
spirv_cross::CompilerGLSL::to_trivial_mix_op
          (CompilerGLSL *this,SPIRType *type,string *op,uint32_t left,uint32_t right,uint32_t lerp)

{
  double dVar1;
  uint uVar2;
  Variant *pVVar3;
  bool bVar4;
  SPIRConstant *pSVar5;
  ulong uVar6;
  SPIRConstant *pSVar7;
  SPIRType *pSVar8;
  SPIRType *type_00;
  uint32_t uVar9;
  ulong uVar10;
  uint uVar11;
  float fVar12;
  uint uVar13;
  uint uVar14;
  bool bVar15;
  string local_50;
  
  uVar10 = (ulong)left;
  uVar6 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size;
  if ((uVar10 < uVar6) &&
     (pVVar3 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
     pVVar3[uVar10].type == TypeConstant)) {
    pSVar5 = Variant::get<spirv_cross::SPIRConstant>(pVVar3 + uVar10);
    uVar6 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size;
  }
  else {
    pSVar5 = (SPIRConstant *)0x0;
  }
  uVar10 = (ulong)right;
  if ((uVar10 < uVar6) &&
     (pVVar3 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
     pVVar3[uVar10].type == TypeConstant)) {
    pSVar7 = Variant::get<spirv_cross::SPIRConstant>(pVVar3 + uVar10);
  }
  else {
    pSVar7 = (SPIRConstant *)0x0;
  }
  pSVar8 = Compiler::expression_type(&this->super_Compiler,lerp);
  if (pSVar5 == (SPIRConstant *)0x0) {
    return false;
  }
  if (pSVar7 == (SPIRConstant *)0x0) {
    return false;
  }
  if ((pSVar5->specialization == false) && (pSVar7->specialization == false)) {
    type_00 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                         *(uint *)&(pSVar5->super_IVariant).field_0xc);
    if (*(int *)&(pSVar8->super_IVariant).field_0xc != 2) {
      return false;
    }
    if (*(int *)&(type_00->super_IVariant).field_0xc == 0xf) {
      return false;
    }
    bVar4 = Compiler::is_array(&this->super_Compiler,type_00);
    if (!bVar4) {
      if ((this->backend).use_constructor_splatting == false) {
        uVar9 = type_00->vecsize;
        if (uVar9 != pSVar8->vecsize) {
          return false;
        }
        if (1 < type_00->columns) {
          return false;
        }
      }
      else {
        if (1 < type_00->columns) {
          return false;
        }
        uVar9 = type_00->vecsize;
      }
      if (uVar9 != 0) {
        uVar6 = 1;
        do {
          switch(*(undefined4 *)&(type->super_IVariant).field_0xc) {
          case 5:
          case 6:
            if (*(short *)((pSVar5->m).c[0].r + (uVar6 - 1)) != 0) {
              return false;
            }
            bVar4 = *(short *)((pSVar7->m).c[0].r + (uVar6 - 1)) == 1;
            break;
          case 7:
          case 8:
            if ((pSVar5->m).c[0].r[uVar6 - 1].u32 != 0) {
              return false;
            }
            bVar4 = (pSVar7->m).c[0].r[uVar6 - 1].u32 == 1;
            break;
          case 9:
          case 10:
            if ((pSVar5->m).c[0].r[uVar6 - 1].u64 != 0) {
              return false;
            }
            bVar4 = (pSVar7->m).c[0].r[uVar6 - 1].u64 == 1;
            break;
          default:
            return false;
          case 0xc:
            uVar2 = (pSVar5->m).c[0].r[uVar6 - 1].u32;
            uVar11 = uVar2 >> 10 & 0x1f;
            uVar13 = uVar2 & 0x3ff;
            if (uVar11 == 0x1f) {
              uVar11 = 0;
              if (uVar13 != 0) {
                uVar11 = (uVar2 & 0xffff) << 0xd;
              }
              uVar11 = uVar11 | 0x7f800000;
            }
            else {
              if (uVar11 == 0) {
                if (uVar13 == 0) {
                  uVar11 = 0;
                  goto LAB_001f40e5;
                }
                uVar2 = 0x1f;
                if (uVar13 != 0) {
                  for (; uVar13 >> uVar2 == 0; uVar2 = uVar2 - 1) {
                  }
                }
                uVar11 = (uVar2 ^ 0xffffffe0) + 0x17;
                uVar13 = uVar13 << (~(byte)uVar2 + 0xb & 0x1f) & 0x1fffbfe;
              }
              uVar11 = uVar11 * 0x800000 + 0x38000000 | uVar13 << 0xd;
            }
LAB_001f40e5:
            if ((uVar11 & 0x7fffffff) != 0) {
              return false;
            }
            uVar2 = (pSVar7->m).c[0].r[uVar6 - 1].u32;
            uVar11 = (uVar2 & 0xffff) >> 0xf;
            uVar13 = uVar2 >> 10 & 0x1f;
            uVar14 = uVar2 & 0x3ff;
            if (uVar13 == 0x1f) {
              uVar11 = uVar11 << 0x1f;
              if (uVar14 != 0) {
                uVar11 = uVar11 | (uVar2 & 0xffff) << 0xd;
              }
              fVar12 = (float)(uVar11 | 0x7f800000);
            }
            else {
              if (uVar13 == 0) {
                if (uVar14 == 0) {
                  fVar12 = (float)(uVar11 << 0x1f);
                  goto LAB_001f4179;
                }
                uVar2 = 0x1f;
                if (uVar14 != 0) {
                  for (; uVar14 >> uVar2 == 0; uVar2 = uVar2 - 1) {
                  }
                }
                uVar13 = (uVar2 ^ 0xffffffe0) + 0x17;
                uVar14 = uVar14 << (~(byte)uVar2 + 0xb & 0x1f) & 0x1fffbfe;
              }
              fVar12 = (float)(uVar13 * 0x800000 + 0x38000000 | uVar11 << 0x1f | uVar14 << 0xd);
            }
            goto LAB_001f4179;
          case 0xd:
            fVar12 = (pSVar5->m).c[0].r[uVar6 - 1].f32;
            if (fVar12 != 0.0) {
              return false;
            }
            if (NAN(fVar12)) {
              return false;
            }
            fVar12 = (pSVar7->m).c[0].r[uVar6 - 1].f32;
LAB_001f4179:
            bVar4 = fVar12 == 1.0;
            break;
          case 0xe:
            dVar1 = (pSVar5->m).c[0].r[uVar6 - 1].f64;
            if (dVar1 != 0.0) {
              return false;
            }
            if (NAN(dVar1)) {
              return false;
            }
            bVar4 = (pSVar7->m).c[0].r[uVar6 - 1].f64 == 1.0;
          }
        } while ((bVar4) && (bVar15 = uVar6 < uVar9, uVar6 = uVar6 + 1, bVar15));
        if (!bVar4) {
          return false;
        }
      }
      type_to_glsl_constructor_abi_cxx11_(&local_50,this,type);
      ::std::__cxx11::string::operator=((string *)op,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool CompilerGLSL::to_trivial_mix_op(const SPIRType &type, string &op, uint32_t left, uint32_t right, uint32_t lerp)
{
	auto *cleft = maybe_get<SPIRConstant>(left);
	auto *cright = maybe_get<SPIRConstant>(right);
	auto &lerptype = expression_type(lerp);

	// If our targets aren't constants, we cannot use construction.
	if (!cleft || !cright)
		return false;

	// If our targets are spec constants, we cannot use construction.
	if (cleft->specialization || cright->specialization)
		return false;

	auto &value_type = get<SPIRType>(cleft->constant_type);

	if (lerptype.basetype != SPIRType::Boolean)
		return false;
	if (value_type.basetype == SPIRType::Struct || is_array(value_type))
		return false;
	if (!backend.use_constructor_splatting && value_type.vecsize != lerptype.vecsize)
		return false;

	// Only valid way in SPIR-V 1.4 to use matrices in select is a scalar select.
	// matrix(scalar) constructor fills in diagnonals, so gets messy very quickly.
	// Just avoid this case.
	if (value_type.columns > 1)
		return false;

	// If our bool selects between 0 and 1, we can cast from bool instead, making our trivial constructor.
	bool ret = true;
	for (uint32_t row = 0; ret && row < value_type.vecsize; row++)
	{
		switch (type.basetype)
		{
		case SPIRType::Short:
		case SPIRType::UShort:
			ret = cleft->scalar_u16(0, row) == 0 && cright->scalar_u16(0, row) == 1;
			break;

		case SPIRType::Int:
		case SPIRType::UInt:
			ret = cleft->scalar(0, row) == 0 && cright->scalar(0, row) == 1;
			break;

		case SPIRType::Half:
			ret = cleft->scalar_f16(0, row) == 0.0f && cright->scalar_f16(0, row) == 1.0f;
			break;

		case SPIRType::Float:
			ret = cleft->scalar_f32(0, row) == 0.0f && cright->scalar_f32(0, row) == 1.0f;
			break;

		case SPIRType::Double:
			ret = cleft->scalar_f64(0, row) == 0.0 && cright->scalar_f64(0, row) == 1.0;
			break;

		case SPIRType::Int64:
		case SPIRType::UInt64:
			ret = cleft->scalar_u64(0, row) == 0 && cright->scalar_u64(0, row) == 1;
			break;

		default:
			ret = false;
			break;
		}
	}

	if (ret)
		op = type_to_glsl_constructor(type);
	return ret;
}